

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selectLinkLayer.cpp
# Opt level: O2

void ShowLinkLayerSyntax2(void)

{
  OsDbgMsg("   -ccat             Link layer = Beckhoff CCAT\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -eg20t            Link layer = EG20T Gigabit Ethernet Controller\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -i8254x           Link layer = Intel 8254x\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -i8255x           Link layer = Intel 8255x\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -r6040            Link layer = R6040\n");
  OsDbgMsg("   -rtl8139          Link layer = Realtek RTL8139\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -rtl8169          Link layer = Realtek RTL8169 / RTL8168 / RTL8111\n");
  OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
  OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
  OsDbgMsg("   -SockRaw          Link layer = raw socket\n");
  OsDbgMsg("     device          network device (e.g. eth1)\n");
  return;
}

Assistant:

EC_T_VOID ShowLinkLayerSyntax2(EC_T_VOID)
{
#if (defined INCLUDE_CCAT)
    OsDbgMsg("   -ccat             Link layer = Beckhoff CCAT\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_CPSW)
    OsDbgMsg("   -cpsw             Link layer = Texas Instruments Common Platform Switch (CPSW)\n");
    OsDbgMsg("     Instance        Device instance (port) 1 P1, 2 P2\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1)\n");
    OsDbgMsg("     PortPriority    Low priority (0) or high priority (1)\n");
    OsDbgMsg("     MasterFlag      (m) Master (Initialize Switch), (s) Slave\n");
    OsDbgMsg("     RefBoard:       custom | bone | am437x-idk | am572x-idk | 387X_evm (optional)\n");
    OsDbgMsg("      if custom       CpswType: am33XX | am437X | am57X | am387X\n");
    OsDbgMsg("      if custom       PhyAddress 0 .. 31\n");
    OsDbgMsg("      if custom       PhyConnection GMII (0) or RGMII (1)\n");
    OsDbgMsg("      if custom       NotUseDmaBuffers FALSE (0) or TRUE (1)\n");
#endif
#if (defined INCLUDE_DW3504)
    OsDbgMsg("   -dw3504           Link layer = Synopsys DesignWare 3504-0 Universal 10/100/1000 Ethernet MAC (DW3504)\n");
    OsDbgMsg("     Instance        Device instance 1 for emac0, 2 for emac1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1)\n");
    OsDbgMsg("     PhyAddress      0 .. 31\n");
    OsDbgMsg("     SoCrates board: Instance=2, PhyAddress=1\n");
#endif
#if (defined INCLUDE_DUMMY)
    OsDbgMsg("   -dummy            Link layer = Dummy\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_EG20T)
    OsDbgMsg("   -eg20t            Link layer = EG20T Gigabit Ethernet Controller\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_EMAC)
    OsDbgMsg("   -emac             Link layer = Xilinx LogiCORE IP XPS EMAC\n");
    OsDbgMsg("     Instance        Device instance (must be 1)\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_ETSEC)
    OsDbgMsg("   -fsletsec         Link layer = Freescale TSEC / eTSEC V1 / eTSEC V2 (VeTSEC)\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_FSLFEC)
    OsDbgMsg("   -fslfec           Link layer = Freescale FEC\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
    OsDbgMsg("     RefBoard: custom | mars | sabrelite | sabresd | imx28evk | topaz\n");
    OsDbgMsg("     if custom FecType: imx25 | imx28 | imx53 | imx6 | vf6\n");
    OsDbgMsg("     if custom PhyInterface: fixed | mii | rmii | gmii | sgmii | rgmii\n");
#endif
#if (defined INCLUDE_GEM)
    OsDbgMsg("   -gem             Link layer = Xilinx Zynq-7000 (GEM)\n");    
    OsDbgMsg("     Instance          Device instance 1 for GEM0, 2 for GEM1\n");
    OsDbgMsg("     Mode              Interrupt (0) or Polling (1)\n");
    OsDbgMsg("     PhyAddress        0 .. 31\n");
    OsDbgMsg("     PhyConnectionMode MIO (0) or EMIO (1)\n");
#endif
#if (defined INCLUDE_I8254X)
    OsDbgMsg("   -i8254x           Link layer = Intel 8254x\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_I8255X)
    OsDbgMsg("   -i8255x           Link layer = Intel 8255x\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_ICSS)
    OsDbgMsg("   -icss             Link layer = Texas Instruments industrial communications subsystem Ethernet Media Access Controller (ICSS)\n");
    OsDbgMsg("     Instance        Device instance PRU1 (1) or PRU2 (2)\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
    OsDbgMsg("     Port            Port inside each PRU ETH0 (0) or ETH1 (1)\n");
#endif
#if (defined INCLUDE_L9218I)
    OsDbgMsg("   -l9218i           Link layer = SMSC LAN9218i/LAN9221\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1)\n");
#endif
#if (defined INCLUDE_NDISUIO)
    OsDbgMsg("   -ndisuio          Link layer = NdisUio\n");
    OsDbgMsg("     Adapter         Device name (registry), ex. PCI\\RTL81391\n");
#endif
#if (defined INCLUDE_R6040)
    OsDbgMsg("   -r6040            Link layer = R6040\n");
#endif
#if (defined EC_VERSION_RIN32M3)
    OsDbgMsg("   -rin32m3         Link layer = RIN32M3\n");
#endif
#if (defined INCLUDE_RTL8139)
    OsDbgMsg("   -rtl8139          Link layer = Realtek RTL8139\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined INCLUDE_RTL8169)
    OsDbgMsg("   -rtl8169          Link layer = Realtek RTL8169 / RTL8168 / RTL8111\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
#if (defined EC_VERSION_RZT1)
    OsDbgMsg("   -rzt1             Link layer = RZT1\n");
    OsDbgMsg("     Instance        Device instance 1 for Port 0 or 2 for Port 1\n");
#endif
#if (defined INCLUDE_SHETH)
    OsDbgMsg("   -sheth            Link layer = Super H Etherner controller\n");
    OsDbgMsg("     Instance        Device instance (1=first), ex. 1\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
    OsDbgMsg("     RefBoard:       a800eva | rzg1e\n");
#endif
#if (defined INCLUDE_SNARF)
    OsDbgMsg("   -snarf            Link layer = SNARF link layer device statically loaded\n");
    OsDbgMsg("    AdapterName      Adapter name, ex. fei0\n");
#endif
#if (defined INCLUDE_SOCKRAW)
    OsDbgMsg("   -SockRaw          Link layer = raw socket\n");
    OsDbgMsg("     device          network device (e.g. eth1)\n");
#endif
#if (defined INCLUDE_WINPCAP)
    OsDbgMsg("   -winpcap          Link layer = WinPcap/NPF\n");
    OsDbgMsg("     IpAddress       IP address of network adapter card, ex. 192.168.157.2\n");
    OsDbgMsg("                     NPF only: 255.255.255.x, x = network adapter number (1,2,...)\n");
    OsDbgMsg("     Mode            Interrupt (0) or Polling (1) mode\n");
#endif
}